

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O2

void duckdb::ArgMinMaxBase<duckdb::LessThan,true>::
     Operation<duckdb::date_t,duckdb::hugeint_t,duckdb::ArgMinMaxState<duckdb::date_t,duckdb::hugeint_t>,duckdb::ArgMinMaxBase<duckdb::LessThan,true>>
               (ArgMinMaxState<duckdb::date_t,_duckdb::hugeint_t> *state,date_t *x,hugeint_t *y,
               AggregateBinaryInput *binary)

{
  int64_t iVar1;
  AggregateBinaryInput *in_R9;
  hugeint_t y_data;
  
  if ((state->super_ArgMinMaxStateBase).is_initialized != false) {
    y_data.upper = (int64_t)binary;
    y_data.lower = y->upper;
    Execute<duckdb::date_t,duckdb::hugeint_t,duckdb::ArgMinMaxState<duckdb::date_t,duckdb::hugeint_t>>
              ((ArgMinMaxBase<duckdb::LessThan,true> *)state,
               (ArgMinMaxState<duckdb::date_t,_duckdb::hugeint_t> *)(ulong)(uint)x->days,
               (date_t)(int32_t)y->lower,y_data,in_R9);
    return;
  }
  TemplatedValidityMask<unsigned_long>::RowIsValid
            (&binary->left_mask->super_TemplatedValidityMask<unsigned_long>,binary->lidx);
  (state->arg).days = x->days;
  iVar1 = y->upper;
  (state->value).lower = y->lower;
  (state->value).upper = iVar1;
  (state->super_ArgMinMaxStateBase).is_initialized = true;
  return;
}

Assistant:

static void Operation(STATE &state, const A_TYPE &x, const B_TYPE &y, AggregateBinaryInput &binary) {
		if (!state.is_initialized) {
			if (IGNORE_NULL || binary.right_mask.RowIsValid(binary.ridx)) {
				Assign(state, x, y, !binary.left_mask.RowIsValid(binary.lidx));
				state.is_initialized = true;
			}
		} else {
			OP::template Execute<A_TYPE, B_TYPE, STATE>(state, x, y, binary);
		}
	}